

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osscurses.cc
# Opt level: O0

void ossdsp(int line,int column,int color,char *msg)

{
  undefined8 in_RCX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  
  if ((in_EDX & 0x800000) == 0) {
    (*globalApp->_vptr_FrobTadsApplication[3])
              (globalApp,(ulong)in_EDI,(ulong)in_ESI,(ulong)in_EDX,in_RCX);
  }
  return;
}

Assistant:

void
ossdsp( int line, int column, int color, const char* msg )
{
    // Suppress output if the text should be invisible.  This is the
    // only way to have "invisible" text without color-support.
    // When colors are enabled, text and background will have the
    // same color, so the text is really invisible in color-mode;
    // A_INVIS is not needed then.
    if (not (color & A_INVIS)) globalApp->print(line, column, color, msg);
}